

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
just::test::assert_equal_container::
run<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
          (assert_equal_container *this,vector<int,_std::allocator<int>_> *a_,
          vector<double,_std::allocator<double>_> *b_)

{
  pointer pdVar1;
  int *piVar2;
  double *pdVar3;
  bool bVar4;
  int *piVar5;
  double *pdVar6;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> i;
  pointer t_;
  ostringstream s;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Expected: ");
  show<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish,(ostream *)local_1a8);
  std::operator<<((ostream *)local_1a8," == ");
  t_ = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  pdVar1 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  std::operator<<((ostream *)local_1a8,"[");
  bVar4 = true;
  for (; t_ != pdVar1; t_ = t_ + 1) {
    if (!bVar4) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    display<double>((ostream *)local_1a8,t_);
    bVar4 = false;
  }
  std::operator<<((ostream *)local_1a8,"]");
  std::__cxx11::stringbuf::str();
  piVar5 = (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (a_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar3 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pdVar6 = (b_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (((piVar5 != piVar2 && (pdVar6 != pdVar3)) && (*pdVar6 == (double)*piVar5)) &&
      (!NAN(*pdVar6) && !NAN((double)*piVar5))); pdVar6 = pdVar6 + 1) {
    piVar5 = piVar5 + 1;
  }
  assert_msg::operator()(&this->_assert_msg,&local_1c8,pdVar6 == pdVar3 && piVar5 == piVar2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void run(const A& a_, const B& b_) const
      {
        std::ostringstream s;
        s << "Expected: ";
        show(a_.begin(), a_.end(), s);
        s << " == ";
        show(b_.begin(), b_.end(), s);

        _assert_msg(
          s.str(),
          ::just::test::equal(a_.begin(), a_.end(), b_.begin(), b_.end())
        );
      }